

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O3

JSValue js_error_constructor(JSContext *ctx,JSValue new_target,int argc,JSValue *argv,int magic)

{
  JSStackFrame *pJVar1;
  JSShape *sh;
  JSValue *pJVar2;
  int iVar3;
  JSContext *pJVar4;
  JSValueUnion *pJVar6;
  ulong uVar7;
  JSValueUnion JVar8;
  int64_t iVar9;
  JSRefCountHeader *p_1;
  ulong uVar10;
  uint uVar11;
  JSRefCountHeader *p;
  JSValue proto_val;
  JSValue val;
  JSValue this_obj;
  JSValue enum_obj;
  JSValue enum_obj_00;
  JSValue v;
  JSValue JVar12;
  JSValue JVar13;
  JSValue JVar14;
  JSValue v_00;
  JSValue JVar15;
  JSValue JVar16;
  JSValue prop;
  JSValue val_00;
  undefined4 uVar17;
  undefined4 in_stack_ffffffffffffff7c;
  undefined4 uVar18;
  BOOL *in_stack_ffffffffffffff80;
  BOOL *pdone;
  JSValueUnion local_60;
  int local_54;
  JSValueUnion local_50;
  int64_t local_48;
  JSValue local_40;
  JSValueUnion JVar5;
  
  iVar9 = new_target.tag;
  JVar8 = new_target.u;
  if ((int)new_target.tag == 3) {
    pJVar1 = ctx->rt->current_stack_frame;
    JVar8 = (JSValueUnion)(pJVar1->cur_func).u.ptr;
    iVar9 = (pJVar1->cur_func).tag;
  }
  JVar12.tag = iVar9;
  JVar12.u.ptr = JVar8.ptr;
  JVar14.tag = iVar9;
  JVar14.u.ptr = JVar8.ptr;
  JVar12 = JS_GetPropertyInternal(ctx,JVar12,0x3b,JVar14,0);
  uVar11 = (uint)JVar12.tag;
  JVar13 = JVar12;
  if (uVar11 == 0xffffffff) {
LAB_00130581:
    JVar12 = JS_NewObjectProtoClass(ctx,JVar13,3);
    iVar3 = *JVar13.u.ptr;
    *(int *)JVar13.u.ptr = iVar3 + -1;
    if (iVar3 < 2) {
      __JS_FreeValueRT(ctx->rt,JVar13);
    }
LAB_001305d4:
    if ((uint)JVar12.tag != 6) {
      if ((int)argv[magic == 7].tag != 3) {
        val.tag = argv[magic == 7].tag;
        val.u.ptr = argv[magic == 7].u.ptr;
        JVar13 = JS_ToStringInternal(ctx,val,0);
        if ((int)JVar13.tag != 6) {
          JS_DefinePropertyValue(ctx,JVar12,0x33,JVar13,3);
          goto LAB_0013063e;
        }
LAB_0013085a:
        if ((0xfffffff4 < (uint)JVar12.tag) &&
           (iVar3 = *JVar12.u.ptr, *(int *)JVar12.u.ptr = iVar3 + -1, iVar3 < 2)) {
          __JS_FreeValueRT(ctx->rt,JVar12);
        }
        uVar7 = 0;
        JVar12 = (JSValue)(ZEXT816(6) << 0x40);
        goto LAB_001308d9;
      }
LAB_0013063e:
      if (magic == 7) {
        uVar7 = 0;
        JVar13 = JS_GetIterator(ctx,*argv,0);
        enum_obj.tag = JVar13.tag;
        JVar8 = JVar13.u;
        if ((uint)JVar13.tag == 6) {
          iVar9 = 6;
          JVar5.float64 = 0.0;
        }
        else {
          uVar17 = 0;
          JVar14 = JS_GetPropertyInternal(ctx,JVar13,0x6a,JVar13,0);
          local_60 = JVar14.u;
          if ((uint)JVar14.tag == 6) {
            JVar5.float64 = 0.0;
            uVar7 = 0;
            iVar9 = 6;
          }
          else {
            sh = ctx->array_shape;
            (sh->header).ref_count = (sh->header).ref_count + 1;
            v_00 = JS_NewObjectFromShape(ctx,sh,2);
            JVar5 = v_00.u;
            if ((int)v_00.tag != 6) {
              local_50 = JVar8;
              local_48 = v_00.tag;
              JVar15 = JS_IteratorNext(ctx,JVar13,JVar14,(int)&local_54,
                                       (JSValue *)CONCAT44(in_stack_ffffffffffffff7c,uVar17),
                                       in_stack_ffffffffffffff80);
              if ((int)JVar15.tag != 6) {
                uVar7 = (ulong)JVar5.ptr >> 0x20;
                uVar10 = 0;
                do {
                  iVar9 = local_48;
                  JVar8 = local_50;
                  if (local_54 != 0) goto LAB_001307ea;
                  JVar8.float64 = (double)(long)uVar10;
                  if (uVar10 >> 0x1f == 0) {
                    iVar9 = 0;
                    JVar8.ptr = (void *)(uVar10 & 0xffffffff);
                  }
                  else {
                    iVar9 = 7;
                  }
                  local_40.tag = JVar15.tag;
                  uVar17 = JVar15.u._0_4_;
                  uVar18 = JVar15.u._4_4_;
                  this_obj.tag = local_48;
                  this_obj.u.ptr = JVar5.ptr;
                  prop.tag = iVar9;
                  prop.u.ptr = JVar8.ptr;
                  pdone = (BOOL *)local_40.tag;
                  local_40 = JVar15;
                  iVar3 = JS_DefinePropertyValueValue(ctx,this_obj,prop,JVar15,0x4007);
                  if (iVar3 < 0) break;
                  uVar10 = uVar10 + 1;
                  enum_obj.u.ptr = local_50.ptr;
                  JVar15 = JS_IteratorNext(ctx,enum_obj,JVar14,(int)&local_54,
                                           (JSValue *)CONCAT44(uVar18,uVar17),pdone);
                } while ((int)JVar15.tag != 6);
              }
              JVar8 = local_50;
              enum_obj_00.tag = enum_obj.tag;
              enum_obj_00.u.ptr = local_50.ptr;
              JS_IteratorClose(ctx,enum_obj_00,1);
              v_00.tag = local_48;
              v_00.u.ptr = JVar5.ptr;
            }
            if ((0xfffffff4 < (uint)v_00.tag) &&
               (iVar3 = *v_00.u.ptr, *(int *)v_00.u.ptr = iVar3 + -1, iVar3 < 2)) {
              __JS_FreeValueRT(ctx->rt,v_00);
            }
            JVar5.float64 = 0.0;
            uVar7 = 0;
            iVar9 = 6;
          }
LAB_001307ea:
          if ((0xfffffff4 < (uint)JVar14.tag) &&
             (iVar3 = *local_60.ptr, *(int *)local_60.ptr = iVar3 + -1, iVar3 < 2)) {
            __JS_FreeValueRT(ctx->rt,JVar14);
          }
        }
        if ((0xfffffff4 < (uint)JVar13.tag) &&
           (iVar3 = *JVar8.ptr, *(int *)JVar8.ptr = iVar3 + -1, iVar3 < 2)) {
          v.tag = enum_obj.tag;
          v.u.ptr = JVar8.ptr;
          __JS_FreeValueRT(ctx->rt,v);
        }
        if ((int)iVar9 == 6) goto LAB_0013085a;
        val_00.tag = iVar9;
        val_00.u.ptr = (void *)(uVar7 << 0x20 | (ulong)JVar5.ptr & 0xffffffff);
        JS_DefinePropertyValue(ctx,JVar12,0x34,val_00,3);
      }
      build_backtrace(ctx,JVar12,(char *)0x0,0,1);
    }
  }
  else if (uVar11 != 6) {
    if ((0xfffffff4 < uVar11) &&
       (iVar3 = *JVar12.u.ptr, *(int *)JVar12.u.ptr = iVar3 + -1, iVar3 < 2)) {
      __JS_FreeValueRT(ctx->rt,JVar12);
    }
    JVar15.tag = iVar9;
    JVar15.u.ptr = JVar8.ptr;
    pJVar4 = JS_GetFunctionRealm(ctx,JVar15);
    if (pJVar4 == (JSContext *)0x0) {
      JVar12 = (JSValue)(ZEXT816(6) << 0x40);
      uVar7 = 0;
      goto LAB_001308d9;
    }
    if (magic < 0) {
      pJVar6 = &pJVar4->class_proto[3].u;
      pJVar2 = pJVar4->class_proto + 3;
    }
    else {
      pJVar6 = &pJVar4->native_error_proto[(uint)magic].u;
      pJVar2 = pJVar4->native_error_proto + (uint)magic;
    }
    JVar8 = (JSValueUnion)pJVar6->ptr;
    iVar9 = pJVar2->tag;
    JVar13.tag = iVar9;
    JVar13.u.ptr = JVar8.ptr;
    if (0xfffffff4 < (uint)iVar9) {
      *(int *)JVar8.ptr = *JVar8.ptr + 1;
      goto LAB_00130581;
    }
    proto_val.tag = iVar9;
    proto_val.u.ptr = JVar8.ptr;
    JVar12 = JS_NewObjectProtoClass(ctx,proto_val,3);
    goto LAB_001305d4;
  }
  uVar7 = (ulong)JVar12.u.ptr & 0xffffffff00000000;
LAB_001308d9:
  JVar16.u.ptr = (void *)((ulong)JVar12.u.ptr & 0xffffffff | uVar7);
  JVar16.tag = JVar12.tag;
  return JVar16;
}

Assistant:

static JSValue js_error_constructor(JSContext *ctx, JSValueConst new_target,
                                    int argc, JSValueConst *argv, int magic)
{
    JSValue obj, msg, proto;
    JSValueConst message;

    if (JS_IsUndefined(new_target))
        new_target = JS_GetActiveFunction(ctx);
    proto = JS_GetProperty(ctx, new_target, JS_ATOM_prototype);
    if (JS_IsException(proto))
        return proto;
    if (!JS_IsObject(proto)) {
        JSContext *realm;
        JSValueConst proto1;
        
        JS_FreeValue(ctx, proto);
        realm = JS_GetFunctionRealm(ctx, new_target);
        if (!realm)
            return JS_EXCEPTION;
        if (magic < 0) {
            proto1 = realm->class_proto[JS_CLASS_ERROR];
        } else {
            proto1 = realm->native_error_proto[magic];
        }
        proto = JS_DupValue(ctx, proto1);
    }
    obj = JS_NewObjectProtoClass(ctx, proto, JS_CLASS_ERROR);
    JS_FreeValue(ctx, proto);
    if (JS_IsException(obj))
        return obj;
    if (magic == JS_AGGREGATE_ERROR) {
        message = argv[1];
    } else {
        message = argv[0];
    }

    if (!JS_IsUndefined(message)) {
        msg = JS_ToString(ctx, message);
        if (unlikely(JS_IsException(msg)))
            goto exception;
        JS_DefinePropertyValue(ctx, obj, JS_ATOM_message, msg,
                               JS_PROP_WRITABLE | JS_PROP_CONFIGURABLE);
    }

    if (magic == JS_AGGREGATE_ERROR) {
        JSValue error_list = iterator_to_array(ctx, argv[0]);
        if (JS_IsException(error_list))
            goto exception;
        JS_DefinePropertyValue(ctx, obj, JS_ATOM_errors, error_list,
                               JS_PROP_WRITABLE | JS_PROP_CONFIGURABLE);
    }

    /* skip the Error() function in the backtrace */
    build_backtrace(ctx, obj, NULL, 0, JS_BACKTRACE_FLAG_SKIP_FIRST_LEVEL);
    return obj;
 exception:
    JS_FreeValue(ctx, obj);
    return JS_EXCEPTION;
}